

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

void check(QPDFMatrix *m,string *exp)

{
  int iVar1;
  ostream *poVar2;
  _Alloc_hider _Var3;
  string u;
  string local_30;
  
  QPDFMatrix::unparse_abi_cxx11_(&local_30,m);
  _Var3._M_p = local_30._M_dataplus._M_p;
  if (local_30._M_string_length == exp->_M_string_length) {
    if (local_30._M_string_length == 0) goto LAB_0011e60e;
    iVar1 = bcmp(local_30._M_dataplus._M_p,(exp->_M_dataplus)._M_p,local_30._M_string_length);
    if (iVar1 == 0) goto LAB_0011e60e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"got ",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", wanted ",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(exp->_M_dataplus)._M_p,exp->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  _Var3._M_p = local_30._M_dataplus._M_p;
LAB_0011e60e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_30.field_2) {
    operator_delete(_Var3._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void
check(QPDFMatrix const& m, std::string const& exp)
{
    std::string u = m.unparse();
    if (u != exp) {
        std::cout << "got " << u << ", wanted " << exp << std::endl;
    }
}